

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

void ma_audio_buffer_uninit_ex(ma_audio_buffer *pAudioBuffer,ma_bool32 doFree)

{
  undefined1 *p;
  _func_void_void_ptr_void_ptr *UNRECOVERED_JUMPTABLE;
  
  if (pAudioBuffer != (ma_audio_buffer *)0x0) {
    if ((pAudioBuffer->ownsData != 0) &&
       (p = (undefined1 *)(pAudioBuffer->ref).pData, p != pAudioBuffer->_pExtraData)) {
      ma_free(p,&pAudioBuffer->allocationCallbacks);
    }
    if ((doFree != 0) &&
       (UNRECOVERED_JUMPTABLE = (pAudioBuffer->allocationCallbacks).onFree,
       UNRECOVERED_JUMPTABLE != (_func_void_void_ptr_void_ptr *)0x0)) {
      (*UNRECOVERED_JUMPTABLE)(pAudioBuffer,(pAudioBuffer->allocationCallbacks).pUserData);
      return;
    }
  }
  return;
}

Assistant:

static void ma_audio_buffer_uninit_ex(ma_audio_buffer* pAudioBuffer, ma_bool32 doFree)
{
    if (pAudioBuffer == NULL) {
        return;
    }

    if (pAudioBuffer->ownsData && pAudioBuffer->ref.pData != &pAudioBuffer->_pExtraData[0]) {
        ma_free((void*)pAudioBuffer->ref.pData, &pAudioBuffer->allocationCallbacks);    /* Naugty const cast, but OK in this case since we've guarded it with the ownsData check. */
    }

    if (doFree) {
        ma_free(pAudioBuffer, &pAudioBuffer->allocationCallbacks);
    }

    ma_audio_buffer_ref_uninit(&pAudioBuffer->ref);
}